

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZSTD_reduceTable(U32 *table,U32 size,U32 reducerValue)

{
  U32 UVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  U32 UVar5;
  
  UVar1 = size + 0xf;
  if (-1 < (int)size) {
    UVar1 = size;
  }
  if ((size & 0xf) == 0) {
    if (-1 < (int)size) {
      if (0xf < (int)size) {
        iVar2 = 0;
        iVar3 = 0;
        do {
          lVar4 = 0;
          do {
            UVar5 = table[iVar2 + lVar4] - reducerValue;
            if (table[iVar2 + lVar4] < reducerValue) {
              UVar5 = 0;
            }
            table[iVar2 + lVar4] = UVar5;
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 != 0x10);
          iVar2 = iVar2 + 0x10;
          iVar3 = iVar3 + 1;
        } while (iVar3 != (int)UVar1 >> 4);
      }
      return;
    }
    __assert_fail("size < (1U<<31)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3178,
                  "void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)");
  }
  __assert_fail("(size & (ZSTD_ROWSIZE-1)) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x3177,
                "void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)");
}

Assistant:

static void ZSTD_reduceTable(U32* const table, U32 const size, U32 const reducerValue)
{
    ZSTD_reduceTable_internal(table, size, reducerValue, 0);
}